

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Erase_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Erase_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  iterator f;
  iterator l;
  bool bVar1;
  pointer ppVar2;
  long lVar3;
  pointer ppVar4;
  char *pcVar5;
  long lVar6;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  int i;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_;
  iterator it;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  key_type *in_stack_fffffffffffffb28;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb30;
  pointer this_01;
  AssertHelper *this_02;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb38;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_03;
  uint *lhs;
  char *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  int iVar7;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  Type type;
  AssertHelper *in_stack_fffffffffffffb60;
  key_type *in_stack_fffffffffffffb68;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb80;
  pointer in_stack_fffffffffffffb90;
  char *in_stack_fffffffffffffb98;
  value_type *in_stack_fffffffffffffba8;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  undefined1 *puVar8;
  AssertionResult local_3c8;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined8 local_380;
  AssertHelper *local_378;
  uint *local_370;
  undefined8 local_360;
  AssertHelper *local_358;
  uint *local_350;
  size_type local_338;
  undefined4 local_32c;
  AssertionResult local_328 [4];
  int local_2dc;
  size_type local_2c8;
  undefined4 local_2bc;
  AssertionResult local_2b8;
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *local_2a8;
  pointer local_2a0;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_298;
  string local_290 [48];
  iterator local_260;
  undefined1 local_239;
  AssertionResult local_238;
  key_type local_228;
  dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_220 [2];
  size_type local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0 [2];
  key_type local_1c0;
  size_type local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8 [2];
  size_type local_188;
  undefined4 local_17c;
  AssertionResult local_178 [2];
  key_type local_158;
  size_type local_150;
  undefined4 local_144;
  AssertionResult local_140 [2];
  size_type local_120;
  undefined4 local_114;
  AssertionResult local_110 [2];
  key_type local_f0;
  size_type local_e8;
  undefined4 local_dc;
  AssertionResult local_d8 [3];
  undefined1 local_a0 [104];
  key_type local_38;
  size_type local_30;
  undefined4 local_24;
  AssertionResult local_20;
  key_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  local_24 = 0;
  local_38 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
  local_30 = google::
             BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,(uint *)in_stack_fffffffffffffb38,
             (unsigned_long *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    testing::AssertionResult::failure_message((AssertionResult *)0xea48c5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,(Type)((ulong)in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0xea4928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea4999);
  ppVar2 = (pointer)(in_RDI + 0x10);
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xea49f6);
  lVar3 = in_RDI + 0x10;
  puVar8 = local_a0;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xea4a53);
  local_dc = 1;
  ppVar4 = (pointer)(in_RDI + 0x10);
  local_f0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20));
  local_e8 = google::
             BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,(uint *)in_stack_fffffffffffffb38,
             (unsigned_long *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffbc8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xea4b61);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,(Type)((ulong)in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0xea4bc4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea4c32);
  local_114 = 1;
  local_120 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea4c4e);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,(uint *)in_stack_fffffffffffffb38,
             (unsigned_long *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_110);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffbc0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xea4cc7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,(Type)((ulong)in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0xea4d2a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea4d9b);
  local_144 = 0;
  local_158 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20))
  ;
  local_150 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,(uint *)in_stack_fffffffffffffb38,
             (unsigned_long *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffbb0 =
         (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xea4e5d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,(Type)((ulong)in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0xea4ec0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea4f2e);
  local_17c = 1;
  local_188 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea4f4a);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,(uint *)in_stack_fffffffffffffb38,
             (unsigned_long *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_178);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffba8 =
         (value_type *)testing::AssertionResult::failure_message((AssertionResult *)0xea4fc3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,(Type)((ulong)in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0xea5026);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea5097);
  local_1ac = 0;
  pcVar5 = (char *)(in_RDI + 0x10);
  local_1c0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20))
  ;
  local_1b8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,(uint *)in_stack_fffffffffffffb38,
             (unsigned_long *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb98 =
         testing::AssertionResult::failure_message((AssertionResult *)0xea5153);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,(Type)((ulong)in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0xea51b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea521e);
  local_1e4 = 1;
  local_1f0 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea523a);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,(uint *)in_stack_fffffffffffffb38,
             (unsigned_long *)in_stack_fffffffffffffb30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb90 =
         (pointer)testing::AssertionResult::failure_message((AssertionResult *)0xea52b3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,(Type)((ulong)in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0xea5310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea5381);
  lVar6 = in_RDI + 0x10;
  local_228 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffb70);
  local_239 = google::
              dense_hashtable_iterator<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(local_220,&local_260);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb30,(bool *)in_stack_fffffffffffffb28,
             (type *)0xea5411);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffba8,pcVar5,in_stack_fffffffffffffb98,
               (char *)in_stack_fffffffffffffb90);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,(Type)((ulong)in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
    std::__cxx11::string::~string(local_290);
    testing::Message::~Message((Message *)0xea54e4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea557b);
  local_2a8 = local_220[0].ht;
  local_2a0 = local_220[0].pos;
  local_298 = (HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_220[0].end;
  it_00.pos = (pointer)lVar6;
  it_00.ht = (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffffb80;
  it_00.end = in_stack_fffffffffffffb90;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffb70,it_00);
  local_2bc = 0;
  local_2c8 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea55f9);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,(uint *)local_220[0].end,
             (unsigned_long *)local_220[0].pos);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
  this_01 = local_220[0].pos;
  this_03 = (HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_220[0].end;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    testing::AssertionResult::failure_message((AssertionResult *)0xea5672);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,(Type)((ulong)in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_220[0].pos);
    testing::Message::~Message((Message *)0xea56cf);
    this_01 = local_220[0].pos;
    this_03 = (HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)local_220[0].end;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea5740);
  for (local_2dc = 10; type = (Type)((ulong)in_stack_fffffffffffffb58 >> 0x20), local_2dc < 100;
      local_2dc = local_2dc + 1) {
    in_stack_fffffffffffffb70 =
         (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)(in_RDI + 0x10);
    HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(this_03,(int)((ulong)this_01 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xea57ac);
  }
  local_32c = 0x5a;
  local_338 = google::
              BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xea5813);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,(uint *)this_03,
             (unsigned_long *)this_01);
  iVar7 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_328);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    testing::AssertionResult::failure_message((AssertionResult *)0xea587a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,iVar7,
               in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xea58d7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea5948);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffb70);
  local_360 = local_380;
  local_358 = local_378;
  local_350 = local_370;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffb70);
  local_398 = local_3b8;
  local_390 = local_3b0;
  local_388 = local_3a8;
  f.pos = (pointer)in_stack_fffffffffffffbc8;
  f.ht = (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffbc0;
  f.end = ppVar4;
  l.pos = (pointer)puVar8;
  l.ht = (dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)lVar3;
  l.end = ppVar2;
  this_02 = local_358;
  lhs = local_350;
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffbb0,f,l);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xea5a4f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_3b0,local_3b8,lhs,(unsigned_long *)this_02);
  iVar7 = (int)((ulong)local_3b0 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0xea5ac8);
    testing::internal::AssertHelper::AssertHelper
              (this_00,(Type)((ulong)pcVar5 >> 0x20),local_3a8,iVar7,local_3b8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper(this_02);
    testing::Message::~Message((Message *)0xea5b25);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xea5b90);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Erase) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(19)));
  EXPECT_EQ(1u, this->ht_.size());

  typename TypeParam::iterator it = this->ht_.find(this->UniqueKey(10));
  EXPECT_TRUE(it != this->ht_.end());
  this->ht_.erase(it);
  EXPECT_EQ(0u, this->ht_.size());

  for (int i = 10; i < 100; i++) this->ht_.insert(this->UniqueObject(i));
  EXPECT_EQ(90u, this->ht_.size());
  this->ht_.erase(this->ht_.begin(), this->ht_.end());
  EXPECT_EQ(0u, this->ht_.size());
}